

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O3

void __thiscall cmOrderDirectories::CollectOriginalDirectories(cmOrderDirectories *this)

{
  cmOrderDirectoriesConstraint *pcVar1;
  bool bVar2;
  int iVar3;
  pointer ppcVar4;
  ulong uVar5;
  ulong uVar6;
  
  AddOriginalDirectories(this,&this->UserDirectories);
  ppcVar4 = (this->ConstraintEntries).
            super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->ConstraintEntries).
      super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppcVar4) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      pcVar1 = ppcVar4[uVar5];
      iVar3 = AddOriginalDirectory(pcVar1->OD,&pcVar1->Directory);
      pcVar1->DirectoryIndex = iVar3;
      ppcVar4 = (this->ConstraintEntries).
                super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar2 = uVar6 < (ulong)((long)(this->ConstraintEntries).
                                    super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar4 >> 3)
      ;
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar2);
  }
  AddOriginalDirectories(this,&this->LanguageDirectories);
  return;
}

Assistant:

void cmOrderDirectories::CollectOriginalDirectories()
{
  // Add user directories specified for inclusion.  These should be
  // indexed first so their original order is preserved as much as
  // possible subject to the constraints.
  this->AddOriginalDirectories(this->UserDirectories);

  // Add directories containing constraints.
  for (unsigned int i = 0; i < this->ConstraintEntries.size(); ++i) {
    this->ConstraintEntries[i]->AddDirectory();
  }

  // Add language runtime directories last.
  this->AddOriginalDirectories(this->LanguageDirectories);
}